

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeOverwriteCell(BtCursor *pCur,BtreePayload *pX)

{
  long lVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  MemPage *pPage;
  BtCursor *in_stack_00000008;
  int nTotal;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  lVar1 = *(long *)(in_RDI + 0x88);
  if ((*(ulong *)(lVar1 + 0x58) <
       (ulong)(*(long *)(in_RDI + 0x38) + (long)(int)(uint)*(ushort *)(in_RDI + 0x44))) ||
     (*(ulong *)(in_RDI + 0x38) <
      (ulong)(*(long *)(lVar1 + 0x50) + (long)(int)(uint)*(ushort *)(lVar1 + 0x12)))) {
    iVar2 = sqlite3CorruptError(0);
  }
  else if ((uint)*(ushort *)(in_RDI + 0x44) == *(int *)(in_RSI + 0x24) + *(int *)(in_RSI + 0x28)) {
    iVar2 = btreeOverwriteContent
                      ((MemPage *)in_stack_00000008,&pPage->isInit,
                       (BtreePayload *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                       ,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  else {
    iVar2 = btreeOverwriteOverflowCell(in_stack_00000008,(BtreePayload *)pPage);
  }
  return iVar2;
}

Assistant:

static int btreeOverwriteCell(BtCursor *pCur, const BtreePayload *pX){
  int nTotal = pX->nData + pX->nZero; /* Total bytes of to write */
  MemPage *pPage = pCur->pPage;       /* Page being written */

  if( pCur->info.pPayload + pCur->info.nLocal > pPage->aDataEnd
   || pCur->info.pPayload < pPage->aData + pPage->cellOffset
  ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  if( pCur->info.nLocal==nTotal ){
    /* The entire cell is local */
    return btreeOverwriteContent(pPage, pCur->info.pPayload, pX,
                                 0, pCur->info.nLocal);
  }else{
    /* The cell contains overflow content */
    return btreeOverwriteOverflowCell(pCur, pX);
  }
}